

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

_Bool dump_content(GError **error)

{
  bool bVar1;
  _Bool _Var2;
  code *pcVar3;
  code *pcVar4;
  code *pcVar5;
  
  if ((output_loc != (char *)0x0) && (_Var2 = get_tempfile(error), !_Var2)) {
    return false;
  }
  if (output_format == FORMAT_JSON) {
    pcVar5 = _print_json_footer;
    pcVar4 = _print_json_record;
    pcVar3 = _print_json_header;
LAB_001047b2:
    bVar1 = false;
  }
  else {
    if (output_format == FORMAT_XML) {
      pcVar5 = _print_xml_footer;
      pcVar4 = _print_xml_record;
      pcVar3 = _print_xml_header;
      goto LAB_001047b2;
    }
    if (output_format != FORMAT_TEXT) {
      g_assertion_message_expr
                ("rifiuti2",
                 "/workspace/llm4binary/github/license_c_cmakelists/abelcheung[P]rifiuti2/src/utils.c"
                 ,0x50b,"dump_content",0);
    }
    if (no_heading == '\x01') {
      g_ptr_array_foreach(meta->records,_print_text_record);
      goto LAB_001047da;
    }
    bVar1 = true;
    pcVar4 = _print_text_record;
    pcVar3 = _print_text_header;
    pcVar5 = (code *)0x0;
  }
  (*pcVar3)(meta);
  g_ptr_array_foreach(meta->records,pcVar4);
  if (!bVar1) {
    (*pcVar5)();
  }
LAB_001047da:
  if (output_loc == (char *)0x0) {
    return true;
  }
  _Var2 = clean_tempfile(output_loc,error);
  return _Var2;
}

Assistant:

bool
dump_content (GError **error)
{
    void (*print_header_func)(const metarecord *);
    void (*print_record_func)(rbin_struct *, const metarecord *);
    void (*print_footer_func)();

    // TODO use g_file_set_contents_full in glib 2.66
    if (output_loc && ! get_tempfile (error))
            return false;

    switch (output_format)
    {
        case FORMAT_TEXT:
            print_header_func = no_heading ?
                NULL : &_print_text_header;
            print_record_func = &_print_text_record;
            print_footer_func = NULL;
            break;
        case FORMAT_XML:
            print_header_func = &_print_xml_header;
            print_record_func = &_print_xml_record;
            print_footer_func = &_print_xml_footer;
            break;
        case FORMAT_JSON:
            print_header_func = &_print_json_header;
            print_record_func = &_print_json_record;
            print_footer_func = &_print_json_footer;
            break;

        default: g_assert_not_reached();
    }

    if (print_header_func != NULL)
        (*print_header_func) (meta);
    g_ptr_array_foreach (meta->records, (GFunc) print_record_func, meta);
    if (print_footer_func != NULL)
        (*print_footer_func) ();

    if (output_loc)
        return clean_tempfile (output_loc, error);
    else
        return true;
}